

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 3DSLoader.cpp
# Opt level: O3

void __thiscall
Assimp::Discreet3DSImporter::ParseHierarchyChunk(Discreet3DSImporter *this,uint16_t parent)

{
  pointer *ppaVar1;
  pointer *pppNVar2;
  pointer *ppaVar3;
  pointer *ppaVar4;
  StreamReader<false,_false> *this_00;
  int8_t *piVar5;
  iterator __position;
  iterator iVar6;
  __normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_> _Var7;
  aiVectorKey *paVar8;
  iterator __position_00;
  __normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_> __seed;
  aiQuatKey *paVar9;
  Node *pNVar10;
  iterator iVar11;
  double dVar12;
  ai_real aVar13;
  undefined4 uVar14;
  char cVar15;
  short sVar16;
  uint uVar17;
  int iVar18;
  Node *pNVar19;
  long lVar20;
  Logger *pLVar21;
  pointer paVar22;
  double *pdVar23;
  pointer paVar24;
  pointer paVar25;
  uint uVar26;
  pointer paVar27;
  double *pdVar28;
  pointer paVar29;
  pointer paVar30;
  pointer paVar31;
  double *pdVar32;
  pointer paVar33;
  pointer paVar34;
  bool bVar35;
  int32_t iVar36;
  ulong uVar37;
  undefined6 in_register_00000032;
  char *pcVar38;
  ushort uVar39;
  vector<aiVectorKey,std::allocator<aiVectorKey>> *this_01;
  float fVar40;
  float fVar41;
  float fVar42;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar43;
  float fVar44;
  pair<Assimp::D3DS::aiFloatKey_*,_long> pVar45;
  string name;
  Chunk chunk;
  undefined1 local_d0 [8];
  float fStack_c8;
  float fStack_c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c0;
  aiFloatKey *local_b0;
  uint local_a4;
  Node *local_a0;
  uint local_94;
  Chunk local_8e;
  undefined1 local_88 [16];
  float local_78;
  float local_68;
  float fStack_64;
  undefined4 uStack_60;
  long local_50;
  float local_48;
  
  local_a4 = (uint)CONCAT62(in_register_00000032,parent);
  local_50 = 0x88;
  if ((local_a4 & 0xfffffffd) == 0xb004) {
    local_50 = 0xb8;
  }
  uVar26 = *(int *)&this->stream->limit - *(int *)&this->stream->current;
  do {
    if (uVar26 < 6) {
      return;
    }
    ReadChunk(this,&local_8e);
    if (0 < (int)(local_8e.Size - 6)) {
      this_00 = this->stream;
      local_94 = StreamReader<false,_false>::SetReadLimit
                           (this_00,(local_8e.Size - 6) +
                                    (*(int *)&this_00->current - *(int *)&this_00->buffer));
      if (0xb01f < local_8e.Flag) {
        switch(local_8e.Flag) {
        case 0xb020:
          StreamReader<false,_false>::IncPtr(this->stream,10);
          uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
          this_01 = (vector<aiVectorKey,std::allocator<aiVectorKey>> *)
                    ((long)&this->mCurrentNode->mParent + local_50);
          std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve
                    ((vector<aiVectorKey,_std::allocator<aiVectorKey>_> *)this_01,(ulong)uVar26);
          if (uVar26 != 0) {
            bVar35 = false;
            do {
              uVar17 = StreamReader<false,_false>::Get<int>(this->stream);
              aStack_c0._M_allocated_capacity._0_4_ = 0;
              fStack_c8 = 0.0;
              fStack_c4 = 0.0;
              local_d0 = (undefined1  [8])(double)uVar17;
              SkipTCBInfo(this);
              fStack_c8 = StreamReader<false,_false>::Get<float>(this->stream);
              fStack_c4 = StreamReader<false,_false>::Get<float>(this->stream);
              aStack_c0._M_allocated_capacity._0_4_ =
                   StreamReader<false,_false>::Get<float>(this->stream);
              iVar6._M_current = *(aiVectorKey **)(this_01 + 8);
              if ((*(aiVectorKey **)this_01 != iVar6._M_current) &&
                 ((double)local_d0 <= iVar6._M_current[-1].mTime)) {
                bVar35 = true;
              }
              if (iVar6._M_current == *(aiVectorKey **)(this_01 + 0x10)) {
                std::vector<aiVectorKey,std::allocator<aiVectorKey>>::
                _M_realloc_insert<aiVectorKey_const&>(this_01,iVar6,(aiVectorKey *)local_d0);
              }
              else {
                *(ulong *)&((iVar6._M_current)->mValue).z =
                     CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                              aStack_c0._M_allocated_capacity._0_4_);
                (iVar6._M_current)->mTime = (double)local_d0;
                ((iVar6._M_current)->mValue).x = fStack_c8;
                ((iVar6._M_current)->mValue).y = fStack_c4;
                *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 0x18;
              }
              uVar26 = uVar26 - 1;
            } while (uVar26 != 0);
            if (bVar35) {
              _Var7._M_current = *(aiVectorKey **)this_01;
              paVar8 = *(aiVectorKey **)(this_01 + 8);
              if (_Var7._M_current != paVar8) {
                lVar20 = ((long)paVar8 - (long)_Var7._M_current >> 3) * -0x5555555555555555;
                std::
                _Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                                     *)local_d0,_Var7,(lVar20 - (lVar20 + 1 >> 0x3f)) + 1 >> 1);
                if (CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                             aStack_c0._M_allocated_capacity._0_4_) == 0) {
                  std::
                  __inplace_stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8);
                }
                else {
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,aiVectorKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8,
                             CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                                      aStack_c0._M_allocated_capacity._0_4_),
                             CONCAT44(fStack_c4,fStack_c8));
                }
                operator_delete((void *)CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                                                 aStack_c0._M_allocated_capacity._0_4_),
                                CONCAT44(fStack_c4,fStack_c8) * 0x18);
                pdVar23 = *(double **)(this_01 + 8);
                if (*(double **)this_01 != pdVar23) {
                  pdVar32 = *(double **)this_01 + 3;
                  do {
                    pdVar28 = pdVar32;
                    if (pdVar28 == pdVar23) goto switchD_003de28e_default;
                    pdVar32 = pdVar28 + 3;
                  } while ((pdVar28[-3] != *pdVar28) || (NAN(pdVar28[-3]) || NAN(*pdVar28)));
                  pdVar28 = pdVar28 + -3;
                  if (pdVar32 != pdVar23) {
                    do {
                      if ((*pdVar28 != *pdVar32) || (NAN(*pdVar28) || NAN(*pdVar32))) {
                        *(undefined4 *)(pdVar28 + 5) = *(undefined4 *)(pdVar32 + 2);
                        dVar12 = pdVar32[1];
                        pdVar28[3] = *pdVar32;
                        pdVar28[4] = dVar12;
                        pdVar28 = pdVar28 + 3;
                      }
                      pdVar32 = pdVar32 + 3;
                    } while (pdVar32 != pdVar23);
                    pdVar23 = *(double **)(this_01 + 8);
                  }
                  if (pdVar28 + 3 != pdVar23) {
                    *(double **)(this_01 + 8) = pdVar28 + 3;
                  }
                }
              }
            }
          }
          break;
        case 0xb021:
          StreamReader<false,_false>::IncPtr(this->stream,10);
          uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
          pNVar19 = this->mCurrentNode;
          std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>::reserve
                    (&pNVar19->aRotationKeys,(ulong)uVar26);
          if (uVar26 != 0) {
            bVar35 = false;
            do {
              uVar17 = StreamReader<false,_false>::Get<int>(this->stream);
              SkipTCBInfo(this);
              fStack_c8 = 1.0;
              fStack_c4 = 0.0;
              aStack_c0._M_allocated_capacity._0_4_ = 0;
              aStack_c0._M_allocated_capacity._4_4_ = 0;
              local_d0 = (undefined1  [8])(double)uVar17;
              fVar40 = StreamReader<false,_false>::Get<float>(this->stream);
              local_b0._0_4_ = fVar40;
              local_88._0_4_ = StreamReader<false,_false>::Get<float>(this->stream);
              local_88._4_4_ = extraout_XMM0_Db;
              local_88._8_4_ = extraout_XMM0_Dc;
              local_88._12_4_ = extraout_XMM0_Dd;
              local_78 = StreamReader<false,_false>::Get<float>(this->stream);
              local_68 = (float)local_88._0_4_;
              uStack_60 = local_88._4_4_;
              fStack_64 = local_78;
              fVar41 = StreamReader<false,_false>::Get<float>(this->stream);
              fVar42 = local_68;
              fVar40 = fStack_64;
              if ((fVar41 == 0.0) && (!NAN(fVar41))) {
                fVar40 = 1.0;
                fVar42 = (float)local_88._0_4_;
              }
              fVar43 = local_68;
              fVar44 = fStack_64;
              if ((local_78 == 0.0) && (!NAN(local_78))) {
                fVar43 = fVar42;
                fVar44 = fVar40;
              }
              if (((float)local_88._0_4_ == 0.0) && (!NAN((float)local_88._0_4_))) {
                local_68 = fVar43;
                fStack_64 = fVar44;
              }
              local_78 = 1.0 / SQRT(fVar41 * fVar41 + local_68 * local_68 + fStack_64 * fStack_64);
              local_88 = ZEXT416((uint)local_78);
              local_78 = fVar41 * local_78;
              local_b0._0_4_ = local_b0._0_4_ * 0.5;
              local_48 = sinf(local_b0._0_4_);
              fStack_c8 = cosf(local_b0._0_4_);
              aStack_c0._M_allocated_capacity._4_4_ = local_78 * local_48;
              fStack_c4 = local_48 * (float)local_88._0_4_ * local_68;
              aStack_c0._M_allocated_capacity._0_4_ = local_48 * (float)local_88._0_4_ * fStack_64;
              __position_00._M_current =
                   (pNVar19->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (((pNVar19->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_start != __position_00._M_current) &&
                 ((double)local_d0 <= __position_00._M_current[-1].mTime)) {
                bVar35 = true;
              }
              if (__position_00._M_current ==
                  (pNVar19->aRotationKeys).super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiQuatKey,std::allocator<aiQuatKey>>::
                _M_realloc_insert<aiQuatKey_const&>
                          ((vector<aiQuatKey,std::allocator<aiQuatKey>> *)&pNVar19->aRotationKeys,
                           __position_00,(aiQuatKey *)local_d0);
              }
              else {
                ((__position_00._M_current)->mValue).y =
                     (float)aStack_c0._M_allocated_capacity._0_4_;
                ((__position_00._M_current)->mValue).z =
                     (float)aStack_c0._M_allocated_capacity._4_4_;
                (__position_00._M_current)->mTime = (double)local_d0;
                ((__position_00._M_current)->mValue).w = fStack_c8;
                ((__position_00._M_current)->mValue).x = fStack_c4;
                ppaVar1 = &(pNVar19->aRotationKeys).
                           super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppaVar1 = *ppaVar1 + 1;
              }
              uVar26 = uVar26 - 1;
            } while (uVar26 != 0);
            if (bVar35) {
              __seed._M_current =
                   (pNVar19->aRotationKeys).
                   super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
              paVar9 = (pNVar19->aRotationKeys).
                       super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (__seed._M_current != paVar9) {
                lVar20 = ((long)paVar9 - (long)__seed._M_current >> 3) * -0x5555555555555555;
                std::
                _Temporary_buffer<__gnu_cxx::__normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>,_aiQuatKey>
                ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<aiQuatKey_*,_std::vector<aiQuatKey,_std::allocator<aiQuatKey>_>_>,_aiQuatKey>
                                     *)local_d0,__seed,(lVar20 - (lVar20 + 1 >> 0x3f)) + 1 >> 1);
                if (CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                             aStack_c0._M_allocated_capacity._0_4_) == 0) {
                  std::
                  __inplace_stable_sort<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (__seed._M_current,paVar9);
                }
                else {
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<aiQuatKey*,std::vector<aiQuatKey,std::allocator<aiQuatKey>>>,aiQuatKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (__seed._M_current,paVar9,
                             CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                                      aStack_c0._M_allocated_capacity._0_4_),
                             CONCAT44(fStack_c4,fStack_c8));
                }
                operator_delete((void *)CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                                                 aStack_c0._M_allocated_capacity._0_4_),
                                CONCAT44(fStack_c4,fStack_c8) * 0x18);
                paVar33 = (pNVar19->aRotationKeys).
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_start;
                paVar24 = (pNVar19->aRotationKeys).
                          super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (paVar33 != paVar24) {
                  paVar33 = paVar33 + 1;
                  do {
                    paVar29 = paVar33;
                    if (paVar29 == paVar24) goto switchD_003de28e_default;
                    paVar33 = paVar29 + 1;
                  } while ((paVar29[-1].mTime != paVar29->mTime) ||
                          (NAN(paVar29[-1].mTime) || NAN(paVar29->mTime)));
                  paVar29 = paVar29 + -1;
                  if (paVar33 != paVar24) {
                    do {
                      if ((paVar29->mTime != paVar33->mTime) ||
                         (NAN(paVar29->mTime) || NAN(paVar33->mTime))) {
                        fVar40 = (paVar33->mValue).z;
                        paVar29[1].mValue.y = (paVar33->mValue).y;
                        paVar29[1].mValue.z = fVar40;
                        fVar40 = (paVar33->mValue).w;
                        fVar42 = (paVar33->mValue).x;
                        paVar29[1].mTime = paVar33->mTime;
                        paVar29[1].mValue.w = fVar40;
                        paVar29[1].mValue.x = fVar42;
                        paVar29 = paVar29 + 1;
                      }
                      paVar33 = paVar33 + 1;
                    } while (paVar33 != paVar24);
                    paVar24 = (pNVar19->aRotationKeys).
                              super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  }
                  if (paVar29 + 1 != paVar24) {
                    (pNVar19->aRotationKeys).
                    super__Vector_base<aiQuatKey,_std::allocator<aiQuatKey>_>._M_impl.
                    super__Vector_impl_data._M_finish = paVar29 + 1;
                  }
                }
              }
            }
          }
          break;
        case 0xb022:
          StreamReader<false,_false>::IncPtr(this->stream,10);
          sVar16 = StreamReader<false,_false>::Get<short>(this->stream);
          uVar37 = (ulong)(uint)(int)sVar16;
          StreamReader<false,_false>::IncPtr(this->stream,2);
          pNVar19 = this->mCurrentNode;
          std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>::reserve
                    (&pNVar19->aScalingKeys,uVar37);
          if (sVar16 != 0) {
            bVar35 = false;
            do {
              uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
              SkipTCBInfo(this);
              aStack_c0._M_allocated_capacity._0_4_ = 0;
              fStack_c8 = 0.0;
              fStack_c4 = 0.0;
              local_d0 = (undefined1  [8])(double)uVar26;
              fStack_c8 = StreamReader<false,_false>::Get<float>(this->stream);
              fStack_c4 = StreamReader<false,_false>::Get<float>(this->stream);
              aStack_c0._M_allocated_capacity._0_4_ =
                   StreamReader<false,_false>::Get<float>(this->stream);
              iVar6._M_current =
                   (pNVar19->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              if (((pNVar19->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start != iVar6._M_current) &&
                 ((double)local_d0 <= iVar6._M_current[-1].mTime)) {
                bVar35 = true;
              }
              if ((fStack_c8 == 0.0) && (!NAN(fStack_c8))) {
                fStack_c8 = 1.0;
              }
              if ((fStack_c4 == 0.0) && (!NAN(fStack_c4))) {
                fStack_c4 = 1.0;
              }
              if (((float)aStack_c0._M_allocated_capacity._0_4_ == 0.0) &&
                 (!NAN((float)aStack_c0._M_allocated_capacity._0_4_))) {
                aStack_c0._M_allocated_capacity._0_4_ = 1.0;
              }
              if (iVar6._M_current ==
                  (pNVar19->aScalingKeys).
                  super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<aiVectorKey,std::allocator<aiVectorKey>>::
                _M_realloc_insert<aiVectorKey_const&>
                          ((vector<aiVectorKey,std::allocator<aiVectorKey>> *)&pNVar19->aScalingKeys
                           ,iVar6,(aiVectorKey *)local_d0);
              }
              else {
                *(ulong *)&((iVar6._M_current)->mValue).z =
                     CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                              aStack_c0._M_allocated_capacity._0_4_);
                (iVar6._M_current)->mTime = (double)local_d0;
                ((iVar6._M_current)->mValue).x = fStack_c8;
                ((iVar6._M_current)->mValue).y = fStack_c4;
                ppaVar4 = &(pNVar19->aScalingKeys).
                           super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                *ppaVar4 = *ppaVar4 + 1;
              }
              uVar26 = (int)uVar37 - 1;
              uVar37 = (ulong)uVar26;
            } while (uVar26 != 0);
            if (bVar35) {
              _Var7._M_current =
                   (pNVar19->aScalingKeys).
                   super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                   super__Vector_impl_data._M_start;
              paVar8 = (pNVar19->aScalingKeys).
                       super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              if (_Var7._M_current != paVar8) {
                lVar20 = ((long)paVar8 - (long)_Var7._M_current >> 3) * -0x5555555555555555;
                std::
                _Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<aiVectorKey_*,_std::vector<aiVectorKey,_std::allocator<aiVectorKey>_>_>,_aiVectorKey>
                                     *)local_d0,_Var7,(lVar20 - (lVar20 + 1 >> 0x3f)) + 1 >> 1);
                if (CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                             aStack_c0._M_allocated_capacity._0_4_) == 0) {
                  std::
                  __inplace_stable_sort<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8);
                }
                else {
                  std::
                  __stable_sort_adaptive<__gnu_cxx::__normal_iterator<aiVectorKey*,std::vector<aiVectorKey,std::allocator<aiVectorKey>>>,aiVectorKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                            (_Var7._M_current,paVar8,
                             CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                                      aStack_c0._M_allocated_capacity._0_4_),
                             CONCAT44(fStack_c4,fStack_c8));
                }
                operator_delete((void *)CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                                                 aStack_c0._M_allocated_capacity._0_4_),
                                CONCAT44(fStack_c4,fStack_c8) * 0x18);
                paVar31 = (pNVar19->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_start;
                paVar22 = (pNVar19->aScalingKeys).
                          super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                          super__Vector_impl_data._M_finish;
                if (paVar31 != paVar22) {
                  paVar31 = paVar31 + 1;
                  do {
                    paVar27 = paVar31;
                    if (paVar27 == paVar22) goto switchD_003de28e_default;
                    paVar31 = paVar27 + 1;
                  } while ((paVar27[-1].mTime != paVar27->mTime) ||
                          (NAN(paVar27[-1].mTime) || NAN(paVar27->mTime)));
                  paVar27 = paVar27 + -1;
                  if (paVar31 != paVar22) {
                    do {
                      if ((paVar27->mTime != paVar31->mTime) ||
                         (NAN(paVar27->mTime) || NAN(paVar31->mTime))) {
                        paVar27[1].mValue.z = (paVar31->mValue).z;
                        fVar40 = (paVar31->mValue).x;
                        fVar42 = (paVar31->mValue).y;
                        paVar27[1].mTime = paVar31->mTime;
                        paVar27[1].mValue.x = fVar40;
                        paVar27[1].mValue.y = fVar42;
                        paVar27 = paVar27 + 1;
                      }
                      paVar31 = paVar31 + 1;
                    } while (paVar31 != paVar22);
                    paVar22 = (pNVar19->aScalingKeys).
                              super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                              super__Vector_impl_data._M_finish;
                  }
                  if (paVar27 + 1 != paVar22) {
                    (pNVar19->aScalingKeys).
                    super__Vector_base<aiVectorKey,_std::allocator<aiVectorKey>_>._M_impl.
                    super__Vector_impl_data._M_finish = paVar27 + 1;
                  }
                }
              }
            }
          }
          break;
        case 0xb023:
          pLVar21 = DefaultLogger::get();
          Logger::error(pLVar21,"3DS: Skipping FOV animation track. This is not supported");
          break;
        case 0xb024:
          if ((short)local_a4 == -0x4ffd) {
            pNVar19 = this->mCurrentNode;
            StreamReader<false,_false>::IncPtr(this->stream,10);
            uVar26 = StreamReader<false,_false>::Get<int>(this->stream);
            std::vector<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>::
            reserve(&pNVar19->aCameraRollKeys,(ulong)uVar26);
            if (uVar26 != 0) {
              bVar35 = false;
              do {
                uVar17 = StreamReader<false,_false>::Get<int>(this->stream);
                local_d0 = (undefined1  [8])(double)uVar17;
                SkipTCBInfo(this);
                fStack_c8 = StreamReader<false,_false>::Get<float>(this->stream);
                __position._M_current =
                     (pNVar19->aCameraRollKeys).
                     super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (((pNVar19->aCameraRollKeys).
                     super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                     ._M_impl.super__Vector_impl_data._M_start != __position._M_current) &&
                   ((double)local_d0 <= __position._M_current[-1].mTime)) {
                  bVar35 = true;
                }
                if (__position._M_current ==
                    (pNVar19->aCameraRollKeys).
                    super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>::
                  _M_realloc_insert<Assimp::D3DS::aiFloatKey_const&>
                            ((vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>
                              *)&pNVar19->aCameraRollKeys,__position,(aiFloatKey *)local_d0);
                }
                else {
                  (__position._M_current)->mTime = (double)local_d0;
                  *(ulong *)&(__position._M_current)->mValue = CONCAT44(fStack_c4,fStack_c8);
                  ppaVar3 = &(pNVar19->aCameraRollKeys).
                             super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                  *ppaVar3 = *ppaVar3 + 1;
                }
                uVar26 = uVar26 - 1;
              } while (uVar26 != 0);
              if (bVar35) {
                paVar34 = (pNVar19->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                paVar25 = (pNVar19->aCameraRollKeys).
                          super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                if (paVar34 != paVar25) {
                  lVar20 = (long)paVar25 - (long)paVar34 >> 4;
                  pVar45 = std::get_temporary_buffer<Assimp::D3DS::aiFloatKey>
                                     ((lVar20 - (lVar20 + 1 >> 0x3f)) + 1 >> 1);
                  lVar20 = pVar45.second;
                  local_b0 = pVar45.first;
                  if (local_b0 == (aiFloatKey *)0x0) {
                    lVar20 = 0;
                    std::
                    __inplace_stable_sort<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>,__gnu_cxx::__ops::_Iter_less_iter>
                              (paVar34,paVar25);
                  }
                  else {
                    std::
                    __stable_sort_adaptive<__gnu_cxx::__normal_iterator<Assimp::D3DS::aiFloatKey*,std::vector<Assimp::D3DS::aiFloatKey,std::allocator<Assimp::D3DS::aiFloatKey>>>,Assimp::D3DS::aiFloatKey*,long,__gnu_cxx::__ops::_Iter_less_iter>
                              (paVar34,paVar25,local_b0,lVar20);
                  }
                  operator_delete(local_b0,lVar20 << 4);
                  paVar34 = (pNVar19->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  paVar25 = (pNVar19->aCameraRollKeys).
                            super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                            ._M_impl.super__Vector_impl_data._M_finish;
                  if (paVar34 != paVar25) {
                    paVar34 = paVar34 + 1;
                    do {
                      paVar30 = paVar34;
                      if (paVar30 == paVar25) goto switchD_003de28e_default;
                      paVar34 = paVar30 + 1;
                    } while ((paVar30[-1].mTime != paVar30->mTime) ||
                            (NAN(paVar30[-1].mTime) || NAN(paVar30->mTime)));
                    paVar30 = paVar30 + -1;
                    if (paVar34 != paVar25) {
                      do {
                        if ((paVar30->mTime != paVar34->mTime) ||
                           (NAN(paVar30->mTime) || NAN(paVar34->mTime))) {
                          aVar13 = paVar34->mValue;
                          uVar14 = *(undefined4 *)&paVar34->field_0xc;
                          paVar30[1].mTime = paVar34->mTime;
                          paVar30[1].mValue = aVar13;
                          *(undefined4 *)&paVar30[1].field_0xc = uVar14;
                          paVar30 = paVar30 + 1;
                        }
                        paVar34 = paVar34 + 1;
                      } while (paVar34 != paVar25);
                      paVar25 = (pNVar19->aCameraRollKeys).
                                super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                                ._M_impl.super__Vector_impl_data._M_finish;
                    }
                    if (paVar30 + 1 != paVar25) {
                      (pNVar19->aCameraRollKeys).
                      super__Vector_base<Assimp::D3DS::aiFloatKey,_std::allocator<Assimp::D3DS::aiFloatKey>_>
                      ._M_impl.super__Vector_impl_data._M_finish = paVar30 + 1;
                    }
                  }
                }
              }
            }
          }
          else {
            pLVar21 = DefaultLogger::get();
            pcVar38 = "3DS: Ignoring roll track for non-camera object";
LAB_003deaeb:
            Logger::warn(pLVar21,pcVar38);
          }
        }
        goto switchD_003de28e_default;
      }
      if (local_8e.Flag == 0xb010) {
        piVar5 = this->stream->current;
        uVar37 = 0xffffffff;
        do {
          cVar15 = StreamReader<false,_false>::Get<signed_char>(this->stream);
          uVar37 = (ulong)((int)uVar37 + 1);
        } while (cVar15 != '\0');
        local_d0 = (undefined1  [8])&aStack_c0;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,piVar5,piVar5 + uVar37);
        pNVar19 = FindNode(this->mRootNode,(string *)local_d0);
        if (pNVar19 == (Node *)0x0) {
          iVar36 = 1;
LAB_003deafa:
          pNVar19 = (Node *)operator_new(0xf8);
          D3DS::Node::Node(pNVar19,(string *)local_d0);
          pNVar19->mInstanceNumber = iVar36;
          StreamReader<false,_false>::IncPtr(this->stream,4);
          sVar16 = StreamReader<false,_false>::Get<short>(this->stream);
          uVar39 = sVar16 + 1;
          pNVar19->mHierarchyPos = uVar39;
          sVar16 = this->mLastNodeIndex;
          pNVar19->mHierarchyIndex = sVar16;
          pNVar10 = this->mCurrentNode;
          if ((pNVar10 == (Node *)0x0) || ((int)pNVar10->mHierarchyPos != (uint)uVar39)) {
            if ((int)(uint)uVar39 < (int)sVar16) {
              InverseNodeSearch(this,pNVar19,pNVar10);
              goto LAB_003debdd;
            }
            iVar11._M_current =
                 (pNVar10->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pNVar10->mChildren).
                super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_a0 = pNVar19;
              std::vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>>::
              _M_realloc_insert<Assimp::D3DS::Node*const&>
                        ((vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>> *)
                         &pNVar10->mChildren,iVar11,&local_a0);
            }
            else {
              *iVar11._M_current = pNVar19;
              pppNVar2 = &(pNVar10->mChildren).
                          super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppNVar2 = *pppNVar2 + 1;
              local_a0 = pNVar19;
            }
            local_a0->mParent = pNVar10;
          }
          else {
            pNVar10 = pNVar10->mParent;
            iVar11._M_current =
                 (pNVar10->mChildren).
                 super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar11._M_current ==
                (pNVar10->mChildren).
                super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              local_a0 = pNVar19;
              std::vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>>::
              _M_realloc_insert<Assimp::D3DS::Node*const&>
                        ((vector<Assimp::D3DS::Node*,std::allocator<Assimp::D3DS::Node*>> *)
                         &pNVar10->mChildren,iVar11,&local_a0);
            }
            else {
              *iVar11._M_current = pNVar19;
              pppNVar2 = &(pNVar10->mChildren).
                          super__Vector_base<Assimp::D3DS::Node_*,_std::allocator<Assimp::D3DS::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppNVar2 = *pppNVar2 + 1;
              local_a0 = pNVar19;
            }
            local_a0->mParent = pNVar10;
LAB_003debdd:
            uVar39 = (short)*(undefined4 *)&this->mLastNodeIndex + 1;
          }
          this->mLastNodeIndex = uVar39;
        }
        else if ((short)local_a4 == -0x4ffe) {
          iVar36 = pNVar19->mInstanceCount + 1;
          pNVar19->mInstanceCount = iVar36;
          goto LAB_003deafa;
        }
        this->mCurrentNode = pNVar19;
LAB_003debf6:
        if (local_d0 != (undefined1  [8])&aStack_c0) {
          operator_delete((void *)local_d0,
                          CONCAT44(aStack_c0._M_allocated_capacity._4_4_,
                                   aStack_c0._M_allocated_capacity._0_4_) + 1);
        }
      }
      else if (local_8e.Flag == 0xb011) {
        pcVar38 = this->stream->current;
        do {
          cVar15 = StreamReader<false,_false>::Get<signed_char>(this->stream);
        } while (cVar15 != '\0');
        iVar18 = std::__cxx11::string::compare((char *)&this->mCurrentNode->mName);
        if (iVar18 == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d0,pcVar38,(allocator<char> *)&local_a0);
          std::__cxx11::string::operator=((string *)&this->mCurrentNode->mName,(string *)local_d0);
          goto LAB_003debf6;
        }
      }
      else if (local_8e.Flag == 0xb013) {
        if ((short)local_a4 != -0x4ffe) {
          pLVar21 = DefaultLogger::get();
          pcVar38 = "3DS: Skipping pivot subchunk for non usual object";
          goto LAB_003deaeb;
        }
        fVar40 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).x = fVar40;
        fVar40 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).y = fVar40;
        fVar40 = StreamReader<false,_false>::Get<float>(this->stream);
        (this->mCurrentNode->vPivot).z = fVar40;
      }
switchD_003de28e_default:
      this->stream->current = this->stream->limit;
      StreamReader<false,_false>::SetReadLimit(this->stream,local_94);
      if (*(int *)&this->stream->limit == *(int *)&this->stream->current) {
        return;
      }
    }
    uVar26 = *(int *)&this->stream->limit - *(int *)&this->stream->current;
  } while( true );
}

Assistant:

void Discreet3DSImporter::ParseHierarchyChunk(uint16_t parent)
{
    ASSIMP_3DS_BEGIN_CHUNK();

    // get chunk type
    switch (chunk.Flag)
    {
    case Discreet3DS::CHUNK_TRACKOBJNAME:

        // This is the name of the object to which the track applies. The chunk also
        // defines the position of this object in the hierarchy.
        {

        // First of all: get the name of the object
        unsigned int cnt = 0;
        const char* sz = (const char*)stream->GetPtr();

        while (stream->GetI1())++cnt;
        std::string name = std::string(sz,cnt);

        // Now find out whether we have this node already (target animation channels
        // are stored with a separate object ID)
        D3DS::Node* pcNode = FindNode(mRootNode,name);
        int instanceNumber = 1;

        if ( pcNode)
        {
            // if the source is not a CHUNK_TRACKINFO block it won't be an object instance
            if (parent != Discreet3DS::CHUNK_TRACKINFO)
            {
                mCurrentNode = pcNode;
                break;
            }
            pcNode->mInstanceCount++;
            instanceNumber = pcNode->mInstanceCount;
        }
        pcNode = new D3DS::Node(name);
        pcNode->mInstanceNumber = instanceNumber;

        // There are two unknown values which we can safely ignore
        stream->IncPtr(4);

        // Now read the hierarchy position of the object
        uint16_t hierarchy = stream->GetI2() + 1;
        pcNode->mHierarchyPos   = hierarchy;
        pcNode->mHierarchyIndex = mLastNodeIndex;

        // And find a proper position in the graph for it
        if (mCurrentNode && mCurrentNode->mHierarchyPos == hierarchy)   {

            // add to the parent of the last touched node
            mCurrentNode->mParent->push_back(pcNode);
            mLastNodeIndex++;
        }
        else if(hierarchy >= mLastNodeIndex)    {

            // place it at the current position in the hierarchy
            mCurrentNode->push_back(pcNode);
            mLastNodeIndex = hierarchy;
        }
        else    {
            // need to go back to the specified position in the hierarchy.
            InverseNodeSearch(pcNode,mCurrentNode);
            mLastNodeIndex++;
        }
        // Make this node the current node
        mCurrentNode = pcNode;
        }
        break;

    case Discreet3DS::CHUNK_TRACKDUMMYOBJNAME:

        // This is the "real" name of a $$$DUMMY object
        {
            const char* sz = (const char*) stream->GetPtr();
            while (stream->GetI1());

            // If object name is DUMMY, take this one instead
            if (mCurrentNode->mName == "$$$DUMMY")  {
                mCurrentNode->mName = std::string(sz);
                break;
            }
        }
        break;

    case Discreet3DS::CHUNK_TRACKPIVOT:

        if ( Discreet3DS::CHUNK_TRACKINFO != parent)
        {
            ASSIMP_LOG_WARN("3DS: Skipping pivot subchunk for non usual object");
            break;
        }

        // Pivot = origin of rotation and scaling
        mCurrentNode->vPivot.x = stream->GetF4();
        mCurrentNode->vPivot.y = stream->GetF4();
        mCurrentNode->vPivot.z = stream->GetF4();
        break;


        // ////////////////////////////////////////////////////////////////////
        // POSITION KEYFRAME
    case Discreet3DS::CHUNK_TRACKPOS:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        bool sortKeys = false;

        // This could also be meant as the target position for
        // (targeted) lights and cameras
        std::vector<aiVectorKey>* l;
        if ( Discreet3DS::CHUNK_TRACKCAMTGT == parent || Discreet3DS::CHUNK_TRACKLIGTGT == parent)  {
            l = & mCurrentNode->aTargetPositionKeys;
        }
        else l = & mCurrentNode->aPositionKeys;

        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiVectorKey v;
            v.mTime = (double)fidx;

            SkipTCBInfo();
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}

        break;

        // ////////////////////////////////////////////////////////////////////
        // CAMERA ROLL KEYFRAME
    case Discreet3DS::CHUNK_TRACKROLL:
        {
        // roll keys are accepted for cameras only
        if (parent != Discreet3DS::CHUNK_TRACKCAMERA)   {
            ASSIMP_LOG_WARN("3DS: Ignoring roll track for non-camera object");
            break;
        }
        bool sortKeys = false;
        std::vector<aiFloatKey>* l = &mCurrentNode->aCameraRollKeys;

        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();
        l->reserve(numFrames);
        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();

            // Setup a new position key
            aiFloatKey v;
            v.mTime = (double)fidx;

            // This is just a single float
            SkipTCBInfo();
            v.mValue = stream->GetF4();

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Add the new keyframe to the list
            l->push_back(v);
        }

        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiFloatKey>), l->end() );
        }}
        break;


        // ////////////////////////////////////////////////////////////////////
        // CAMERA FOV KEYFRAME
    case Discreet3DS::CHUNK_TRACKFOV:
        {
            ASSIMP_LOG_ERROR("3DS: Skipping FOV animation track. "
                "This is not supported");
        }
        break;


        // ////////////////////////////////////////////////////////////////////
        // ROTATION KEYFRAME
    case Discreet3DS::CHUNK_TRACKROTATE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI4();

        bool sortKeys = false;
        std::vector<aiQuatKey>* l = &mCurrentNode->aRotationKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            aiQuatKey v;
            v.mTime = (double)fidx;

            // The rotation keyframe is given as an axis-angle pair
            const float rad = stream->GetF4();
            aiVector3D axis;
            axis.x = stream->GetF4();
            axis.y = stream->GetF4();
            axis.z = stream->GetF4();

            if (!axis.x && !axis.y && !axis.z)
                axis.y = 1.f;

            // Construct a rotation quaternion from the axis-angle pair
            v.mValue = aiQuaternion(axis,rad);

            // Check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // add the new keyframe to the list
            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiQuatKey>), l->end() );
        }}
        break;

        // ////////////////////////////////////////////////////////////////////
        // SCALING KEYFRAME
    case Discreet3DS::CHUNK_TRACKSCALE:
        {
        stream->IncPtr(10);
        const unsigned int numFrames = stream->GetI2();
        stream->IncPtr(2);

        bool sortKeys = false;
        std::vector<aiVectorKey>* l = &mCurrentNode->aScalingKeys;
        l->reserve(numFrames);

        for (unsigned int i = 0; i < numFrames;++i) {
            const unsigned int fidx = stream->GetI4();
            SkipTCBInfo();

            // Setup a new key
            aiVectorKey v;
            v.mTime = (double)fidx;

            // ... and read its value
            v.mValue.x = stream->GetF4();
            v.mValue.y = stream->GetF4();
            v.mValue.z = stream->GetF4();

            // check whether we'll need to sort the keys
            if (!l->empty() && v.mTime <= l->back().mTime)
                sortKeys = true;

            // Remove zero-scalings on singular axes - they've been reported to be there erroneously in some strange files
            if (!v.mValue.x) v.mValue.x = 1.f;
            if (!v.mValue.y) v.mValue.y = 1.f;
            if (!v.mValue.z) v.mValue.z = 1.f;

            l->push_back(v);
        }
        // Sort all keys with ascending time values and remove duplicates?
        if (sortKeys)   {
            std::stable_sort(l->begin(),l->end());
            l->erase ( std::unique (l->begin(),l->end(),&KeyUniqueCompare<aiVectorKey>), l->end() );
        }}
        break;
    };

    ASSIMP_3DS_END_CHUNK();
}